

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender __thiscall
fmt::v10::detail::write_escaped_string<char,fmt::v10::appender>
          (detail *this,appender out,basic_string_view<char> str)

{
  long lVar1;
  size_t sVar2;
  anon_class_8_1_6971b95b_for_f f;
  ulong uVar3;
  buffer<char> *pbVar4;
  string_view s;
  find_escape_result<char> escape;
  find_escape_result<char> local_48;
  
  lVar1 = *(long *)(this + 0x10);
  uVar3 = lVar1 + 1;
  if (*(ulong *)(this + 0x18) < uVar3) {
    (*(code *)**(undefined8 **)this)(this,uVar3,str.data_,str.size_);
    lVar1 = *(long *)(this + 0x10);
    uVar3 = lVar1 + 1;
  }
  f.result = *(find_escape_result<char> **)(this + 8);
  *(ulong *)(this + 0x10) = uVar3;
  *(undefined1 *)((long)&(f.result)->begin + lVar1) = 0x22;
  pbVar4 = (buffer<char> *)
           (str.data_ +
           (long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
  do {
    local_48.end = (char *)0x0;
    local_48.cp = 0;
    local_48.begin = (char *)pbVar4;
    if ((long)pbVar4 -
        (long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                  ,0x189,"negative value");
    }
    s.size_ = (size_t)&local_48;
    s.data_ = (char *)((long)pbVar4 -
                      (long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container);
    for_each_codepoint<fmt::v10::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v10::basic_string_view<char>)_1_>
              ((detail *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,s
               ,f);
    buffer<char>::append<char>
              ((buffer<char> *)this,
               (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
               local_48.begin);
    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_48.end;
    if ((buffer<char> *)local_48.end == (buffer<char> *)0x0) break;
    this = (detail *)write_escaped_cp<fmt::v10::appender,char>((appender)this,&local_48);
  } while (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container !=
           (back_insert_iterator<fmt::v10::detail::buffer<char>_>)pbVar4);
  sVar2 = ((buffer<char> *)this)->size_;
  uVar3 = sVar2 + 1;
  if (((buffer<char> *)this)->capacity_ < uVar3) {
    (**((buffer<char> *)this)->_vptr_buffer)(this);
    sVar2 = ((buffer<char> *)this)->size_;
    uVar3 = sVar2 + 1;
  }
  ((buffer<char> *)this)->size_ = uVar3;
  ((buffer<char> *)this)->ptr_[sVar2] = '\"';
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)this;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}